

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O2

char find_placeholder_char(Am_Object *cmd,Am_Slot_Key slot)

{
  bool bVar1;
  int iVar2;
  Am_Value *pAVar3;
  ostream *poVar4;
  char unaff_R12B;
  Am_Object ph;
  Am_Value_List placeholders;
  Am_Value v;
  
  pAVar3 = Am_Object::Get(cmd,Am_PLACEHOLDERS_SET_BY_THIS_COMMAND,3);
  Am_Value_List::Am_Value_List(&placeholders,pAVar3);
  bVar1 = Am_Value_List::Valid(&placeholders);
  if (bVar1) {
    v.type = 0;
    v.value.wrapper_value = (Am_Wrapper *)0x0;
    ph.data = (Am_Object_Data *)0x0;
    if (am_sdebug == true) {
      poVar4 = std::operator<<((ostream *)&std::cout,"searching placeholders ");
      poVar4 = operator<<(poVar4,&placeholders);
      poVar4 = std::operator<<(poVar4," for slot ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,slot);
      std::endl<char,std::char_traits<char>>(poVar4);
      std::ostream::flush();
    }
    Am_Value_List::Start(&placeholders);
    while( true ) {
      bVar1 = Am_Value_List::Last(&placeholders);
      if (bVar1) break;
      pAVar3 = Am_Value_List::Get(&placeholders);
      Am_Object::operator=(&ph,pAVar3);
      pAVar3 = Am_Object::Get(&ph,0x19c,0);
      iVar2 = Am_Value::operator_cast_to_int(pAVar3);
      if ((Am_Slot_Key)iVar2 == slot) {
        pAVar3 = Am_Object::Get(&ph,0x153,0);
        unaff_R12B = Am_Value::operator_cast_to_char(pAVar3);
        break;
      }
      Am_Value_List::Next(&placeholders);
    }
    Am_Object::~Am_Object(&ph);
    Am_Value::~Am_Value(&v);
    if (!bVar1) goto LAB_0021c3fd;
  }
  unaff_R12B = '\0';
LAB_0021c3fd:
  Am_Value_List::~Am_Value_List(&placeholders);
  return unaff_R12B;
}

Assistant:

char
find_placeholder_char(Am_Object &cmd, Am_Slot_Key slot)
{
  Am_Value_List placeholders =
      cmd.Get(Am_PLACEHOLDERS_SET_BY_THIS_COMMAND, Am_RETURN_ZERO_ON_ERROR);
  if (placeholders.Valid()) {
    Am_Value v;
    Am_Object ph;
    if (am_sdebug)
      std::cout << "searching placeholders " << placeholders << " for slot "
                << slot << std::endl
                << std::flush;
    Am_Slot_Key found_slot;
    for (placeholders.Start(); !placeholders.Last(); placeholders.Next()) {
      ph = placeholders.Get();
      found_slot = (Am_Slot_Key)(int)ph.Get(Am_SLOT_FOR_VALUE);
      if (found_slot == slot) {
        char ret = ph.Get(Am_ID);
        return ret;
      }
    }
  }
  return 0;
}